

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppendWithAnnotations.cpp
# Opt level: O2

EStatusCode EmbedPagesInPDF(PDFWriter *inTargetWriter,string *inSourcePDF)

{
  bool bVar1;
  EPDFObjectType EVar2;
  EStatusCode EVar3;
  DocumentContext *pDVar4;
  PDFParsingOptions *inOptions;
  PDFDocumentCopyingContext *this;
  PDFParser *pPVar5;
  unsigned_long uVar6;
  PDFDictionary *pPVar7;
  ObjectsContext *this_00;
  _func_int **inAnnotationObjectRef;
  ulong inPageIndex;
  EStatusCodeAndObjectIDType EVar8;
  RefCountPtr<PDFObject> annotsObject;
  RefCountPtr<PDFDictionary> pageDictionary;
  EStatusCodeAndObjectIDTypeList result;
  AnnotationsWriter annotationsWriter;
  string local_70;
  string local_50;
  
  AnnotationsWriter::AnnotationsWriter(&annotationsWriter);
  pDVar4 = PDFWriter::GetDocumentContext(inTargetWriter);
  PDFHummus::DocumentContext::AddDocumentContextExtender
            (pDVar4,(IDocumentContextExtender *)&annotationsWriter);
  inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
  this = PDFWriter::CreatePDFCopyingContext(inTargetWriter,inSourcePDF,inOptions);
  if (this == (PDFDocumentCopyingContext *)0x0) {
    EVar3 = eFailure;
  }
  else {
    pPVar5 = PDFDocumentCopyingContext::GetSourceDocumentParser(this);
    uVar6 = PDFParser::GetPagesCount(pPVar5);
    inPageIndex = 0;
    EVar3 = eSuccess;
    do {
      if ((uVar6 <= inPageIndex) || (EVar3 != eSuccess)) break;
      pPVar5 = PDFDocumentCopyingContext::GetSourceDocumentParser(this);
      pPVar7 = PDFParser::ParsePage(pPVar5,inPageIndex);
      pageDictionary._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d830;
      pageDictionary.mValue = pPVar7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Annots",(allocator<char> *)&result);
      bVar1 = PDFDictionary::Exists(pPVar7,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pPVar7 = pageDictionary.mValue;
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Annots",(allocator<char> *)&result);
        annotsObject.mValue = PDFDictionary::QueryDirectObject(pPVar7,&local_70);
        annotsObject._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
        std::__cxx11::string::~string((string *)&local_70);
        EVar2 = PDFObject::GetType(annotsObject.mValue);
        if (EVar2 == ePDFObjectIndirectObjectReference) {
          inAnnotationObjectRef = annotsObject.mValue[1].super_RefCountObject._vptr_RefCountObject;
          EVar3 = eSuccess;
LAB_00126e91:
          bVar1 = true;
          AnnotationsWriter::SetAnnotationObjectReference
                    (&annotationsWriter,(ObjectIDType)inAnnotationObjectRef);
        }
        else {
          this_00 = PDFWriter::GetObjectsContext(inTargetWriter);
          inAnnotationObjectRef = (_func_int **)ObjectsContext::StartNewIndirectObject(this_00);
          if (inAnnotationObjectRef == (_func_int **)0x0) {
            bVar1 = false;
            EVar3 = eFailure;
          }
          else {
            PDFDocumentCopyingContext::CopyDirectObjectWithDeepCopy_abi_cxx11_
                      (&result,this,annotsObject.mValue);
            if (result.first == eSuccess) {
              ObjectsContext::EndIndirectObject(this_00);
              EVar3 = PDFDocumentCopyingContext::CopyNewObjectsForDirectObject(this,&result.second);
              bVar1 = EVar3 == eSuccess;
            }
            else {
              bVar1 = false;
              EVar3 = result.first;
            }
            std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                      (&result.second.
                        super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
            if (bVar1) goto LAB_00126e91;
            bVar1 = false;
          }
        }
        RefCountPtr<PDFObject>::~RefCountPtr(&annotsObject);
        if (bVar1) goto LAB_00126eb3;
        bVar1 = false;
      }
      else {
LAB_00126eb3:
        EVar8 = PDFDocumentCopyingContext::AppendPDFPageFromPDF(this,inPageIndex);
        EVar3 = EVar8.first;
        bVar1 = true;
      }
      RefCountPtr<PDFDictionary>::~RefCountPtr(&pageDictionary);
      inPageIndex = inPageIndex + 1;
    } while (bVar1);
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this);
  }
  operator_delete(this,0xd0);
  pDVar4 = PDFWriter::GetDocumentContext(inTargetWriter);
  PDFHummus::DocumentContext::RemoveDocumentContextExtender
            (pDVar4,(IDocumentContextExtender *)&annotationsWriter);
  return EVar3;
}

Assistant:

EStatusCode EmbedPagesInPDF(PDFWriter* inTargetWriter, const string& inSourcePDF)
{
	EStatusCode status = eSuccess;
	PDFDocumentCopyingContext* copyingContext;
	AnnotationsWriter annotationsWriter;
	
	inTargetWriter->GetDocumentContext().AddDocumentContextExtender(&annotationsWriter);
	do
	{

		copyingContext = inTargetWriter->CreatePDFCopyingContext(inSourcePDF);
		if(!copyingContext)
		{
			status = eFailure;
			break;
		}

		unsigned long pagesCount = copyingContext->GetSourceDocumentParser()->GetPagesCount();
		for(unsigned long i=0; i < pagesCount && eSuccess == status; ++i)
		{
			RefCountPtr<PDFDictionary> pageDictionary(copyingContext->GetSourceDocumentParser()->ParsePage(i));

			if(pageDictionary->Exists("Annots")) {
				// just copy the annots object into an indirect object, if it's not already that...later we can just attach the ref to the page.
				// copying will take care of recreating the annots object and internal object in whatever way there are in the original document,
				// so no need ot worry about whether they are references or direct objects
				ObjectIDType annotsRef;
				RefCountPtr<PDFObject> annotsObject = pageDictionary->QueryDirectObject("Annots");

				if(annotsObject->GetType() == PDFObject::ePDFObjectIndirectObjectReference) {
					annotsRef = ((PDFIndirectObjectReference*)(annotsObject.GetPtr()))->mObjectID;
				} else {
					// direct object. recreate as indirect, for the sake of simplicity. after its done copying, copy what indirect objects
					// it refers to (indirect annotation objects...normally)
					ObjectsContext& objectsContext = inTargetWriter->GetObjectsContext();

					annotsRef = objectsContext.StartNewIndirectObject();	
					if(annotsRef == 0) {
						status = eFailure;
						break;
					}
					EStatusCodeAndObjectIDTypeList result = copyingContext->CopyDirectObjectWithDeepCopy(annotsObject.GetPtr());

					status = result.first;
					if(status != eSuccess)
					 	break;

					objectsContext.EndIndirectObject();

					// done copying the annots object, now copy its depenencies
					status = copyingContext->CopyNewObjectsForDirectObject(result.second);
					if(status != eSuccess)
						break;
				}

				// report to end page handler, so it can use this reference when writing the page
				annotationsWriter.SetAnnotationObjectReference(annotsRef);

			}

			status = copyingContext->AppendPDFPageFromPDF(i).first;

		}
	} while(false);

	delete copyingContext;
	inTargetWriter->GetDocumentContext().RemoveDocumentContextExtender(&annotationsWriter);
	return status;
}